

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

void __thiscall
google::protobuf::internal::TcParser::
WriteLengthDelimitedToUnknown<google::protobuf::UnknownFieldSet>
          (TcParser *this,MessageLite *msg,int number,string_view value)

{
  UnknownFieldSet *this_00;
  undefined4 in_register_00000014;
  string_view value_00;
  
  value_00._M_len._4_4_ = in_register_00000014;
  value_00._M_len._0_4_ = number;
  value_00._M_str = (char *)value._M_len;
  this_00 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                      ((InternalMetadata *)(this + 8));
  UnknownFieldSet::AddLengthDelimited(this_00,(int)msg,value_00);
  return;
}

Assistant:

static void WriteLengthDelimitedToUnknown(MessageLite* msg, int number,
                                            absl::string_view value) {
    internal::WriteLengthDelimited(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }